

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

float __thiscall Assimp::CFIReaderImpl::getAttributeValueAsFloat(CFIReaderImpl *this,int idx)

{
  pointer pAVar1;
  element_type *peVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  char in_CL;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  float fVar5;
  ai_real ret;
  float local_1c;
  
  fVar5 = 0.0;
  if ((-1 < idx) &&
     (pAVar1 = (this->attributes).
               super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_start,
     idx < (int)((ulong)((long)(this->attributes).
                               super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) >> 4) *
           0x38e38e39)) {
    peVar2 = pAVar1[(uint)idx].value.
             super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      lVar4 = 0;
    }
    else {
      in_CL = '\0';
      lVar4 = __dynamic_cast(peVar2,&FIValue::typeinfo,&FIFloatValue::typeinfo);
    }
    if (lVar4 == 0) {
      lVar4 = 0;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      in_CL = (char)(pAVar1 + (uint)idx) + -0x80;
      this_00 = pAVar1[(uint)idx].value.
                super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        in_CL = -0x70;
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
    }
    if (lVar4 == 0) {
      iVar3 = (**((this->attributes).
                  super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                  ._M_impl.super__Vector_impl_data._M_start[(uint)idx].value.
                  super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_FIValue)();
      local_1c = 0.0;
      fast_atoreal_move<float>
                (*(Assimp **)CONCAT44(extraout_var,iVar3),(char *)&local_1c,(float *)0x1,(bool)in_CL
                );
      fVar5 = local_1c;
    }
    else {
      fVar5 = 0.0;
      if (*(long *)(lVar4 + 0x10) - (long)*(float **)(lVar4 + 8) == 4) {
        fVar5 = **(float **)(lVar4 + 8);
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return fVar5;
}

Assistant:

virtual float getAttributeValueAsFloat(int idx) const /*override*/ {
        if (idx < 0 || idx >= (int)attributes.size()) {
            return 0;
        }
        std::shared_ptr<const FIFloatValue> floatValue = std::dynamic_pointer_cast<const FIFloatValue>(attributes[idx].value);
        if (floatValue) {
            return floatValue->value.size() == 1 ? floatValue->value.front() : 0;
        }
        return fast_atof(attributes[idx].value->toString().c_str());
    }